

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
GlobOpt::InsertCloneStrs
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,GlobOptBlockData *fromData)

{
  Loop *pLVar1;
  BasicBlock *this_00;
  SymTable *this_01;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BVIndex id_00;
  undefined4 *puVar5;
  StackSym *sym_00;
  Value *this_02;
  Value *this_03;
  ValueInfo *pVVar6;
  ValueInfo *pVVar7;
  Instr *this_04;
  RegOpnd *newDst;
  RegOpnd *opnd;
  Instr *cloneStr;
  ValueInfo *loopValueInfo;
  ValueInfo *landingPadValueInfo;
  Value *loopValue;
  Value *landingPadValue;
  StackSym *sym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  SymTable *symTable;
  BasicBlock *landingPad;
  Loop *loop;
  GlobOptBlockData *fromData_local;
  GlobOptBlockData *toData_local;
  BasicBlock *toBlock_local;
  GlobOpt *this_local;
  
  if ((((*(ushort *)&toBlock->field_0x18 >> 2 & 1) != 0) &&
      (toBlock->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (bVar3 = IsLoopPrePass(this), !bVar3)) {
    pLVar1 = toBlock->loop;
    this_00 = pLVar1->landingPad;
    this_01 = this->func->m_symTable;
    bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1574,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::And
              (this->tempBv,toBlock->cloneStrCandidates,fromData->isTempSrc);
    for (__startIndex = this->tempBv->head; __startIndex != (Type_conflict)0x0;
        __startIndex = __startIndex->next) {
      _unit.word._0_4_ = __startIndex->startIndex;
      sym = (StackSym *)(__startIndex->data).word;
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
      while (_unit.word._4_4_ != 0xffffffff) {
        id_00 = (Type)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&sym,_unit.word._4_4_);
        sym_00 = (StackSym *)SymTable::Find(this_01,id_00);
        if (sym_00 == (StackSym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x1579,"(sym)","sym");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test((this_00->globOptData).liveVarSyms,id_00);
        if (((BVar4 != '\0') &&
            (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test(fromData->liveVarSyms,id_00),
            BVar4 != '\0')) &&
           ((this_02 = GlobOptBlockData::FindValue(&this_00->globOptData,(Sym *)sym_00),
            this_02 != (Value *)0x0 &&
            (this_03 = GlobOptBlockData::FindValue(fromData,(Sym *)sym_00), this_03 != (Value *)0x0)
            ))) {
          pVVar6 = ::Value::GetValueInfo(this_02);
          pVVar7 = ::Value::GetValueInfo(this_03);
          bVar3 = ValueType::IsLikelyString(&pVVar6->super_ValueType);
          if ((bVar3) && (bVar3 = ValueType::IsLikelyString(&pVVar7->super_ValueType), bVar3)) {
            this_04 = IR::Instr::New(CloneStr,this->func);
            newDst = IR::RegOpnd::New(sym_00,TyVar,this->func);
            IR::Instr::SetDst(this_04,&newDst->super_Opnd);
            IR::Instr::SetSrc1(this_04,&newDst->super_Opnd);
            if (pLVar1->bailOutInfo->bailOutInstr == (Instr *)0x0) {
              BasicBlock::InsertAfter(this_00,this_04);
            }
            else {
              IR::Instr::InsertBefore(pLVar1->bailOutInfo->bailOutInstr,this_04);
            }
            BVSparse<Memory::JitArenaAllocator>::Set(toData->isTempSrc,id_00);
          }
        }
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
      }
      if (__startIndex == (Type_conflict)0x0) break;
    }
    BVSparse<Memory::JitArenaAllocator>::ClearAll(this->tempBv);
  }
  return;
}

Assistant:

void GlobOpt::InsertCloneStrs(BasicBlock *toBlock, GlobOptBlockData *toData, GlobOptBlockData *fromData)
{
    if (toBlock->isLoopHeader   // isLoopBackEdge
        && toBlock->cloneStrCandidates
        && !IsLoopPrePass())
    {
        Loop *loop = toBlock->loop;
        BasicBlock *landingPad = loop->landingPad;
        const SymTable *const symTable = func->m_symTable;
        Assert(tempBv->IsEmpty());
        tempBv->And(toBlock->cloneStrCandidates, fromData->isTempSrc);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const sym = (StackSym *)symTable->Find(id);
            Assert(sym);

            if (!landingPad->globOptData.liveVarSyms->Test(id)
                || !fromData->liveVarSyms->Test(id))
            {
                continue;
            }

            Value * landingPadValue = landingPad->globOptData.FindValue(sym);
            if (landingPadValue == nullptr)
            {
                continue;
            }

            Value * loopValue = fromData->FindValue(sym);
            if (loopValue == nullptr)
            {
                continue;
            }

            ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
            ValueInfo *loopValueInfo = loopValue->GetValueInfo();

            if (landingPadValueInfo->IsLikelyString()
                && loopValueInfo->IsLikelyString())
            {
                IR::Instr *cloneStr = IR::Instr::New(Js::OpCode::CloneStr, this->func);
                IR::RegOpnd *opnd = IR::RegOpnd::New(sym, IRType::TyVar, this->func);
                cloneStr->SetDst(opnd);
                cloneStr->SetSrc1(opnd);
                if (loop->bailOutInfo->bailOutInstr)
                {
                    loop->bailOutInfo->bailOutInstr->InsertBefore(cloneStr);
                }
                else
                {
                    landingPad->InsertAfter(cloneStr);
                }
                toData->isTempSrc->Set(id);
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }
}